

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestOneof2_FooGroup * __thiscall
proto2_unittest::TestOneof2::_internal_mutable_foogroup(TestOneof2 *this)

{
  TestOneof2_FooGroup *pTVar1;
  Arena *arena;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 8) {
    pTVar1 = (TestOneof2_FooGroup *)(this->field_0)._impl_.foo_.foo_message_;
  }
  else {
    clear_foo(this);
    (this->field_0)._impl_._oneof_case_[0] = 8;
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pTVar1 = (TestOneof2_FooGroup *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestOneof2_FooGroup>(arena);
    (this->field_0)._impl_.foo_.foo_message_ = (Message *)pTVar1;
  }
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestOneof2_FooGroup* PROTOBUF_NONNULL TestOneof2::_internal_mutable_foogroup() {
  if (foo_case() != kFoogroup) {
    clear_foo();
    set_has_foogroup();
    _impl_.foo_.foogroup_ = reinterpret_cast<::google::protobuf::Message*>(
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestOneof2_FooGroup>(GetArena()));
  }
  return reinterpret_cast<::proto2_unittest::TestOneof2_FooGroup*>(_impl_.foo_.foogroup_);
}